

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O1

ValueType __thiscall ValueType::ToDefiniteNumber(ValueType *this)

{
  code *pcVar1;
  bool bVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar3;
  undefined4 *puVar4;
  
  if (((this->field_0).bits & (Number|Float|Int)) == 0 ||
      ((this->field_0).bits &
      ~(Number|Float|IntIsLikelyUntagged|IntCanBeUntagged|Int|CanBeTaggedValue|Undefined|Likely)) !=
      0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x3bb,"(IsLikelyNumber())","IsLikelyNumber()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  aVar3.field_0 = (this->field_0).field_0;
  if ((aVar3.bits & (Number|Float|Int)) != 0 &&
      (aVar3.bits & ~(Number|Float|IntIsLikelyUntagged|IntCanBeUntagged|Int|CanBeTaggedValue)) == 0)
  {
    return (anon_union_2_4_ea848c7b_for_ValueType_13)
           (anon_union_2_4_ea848c7b_for_ValueType_13)aVar3.field_0;
  }
  aVar3.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ToDefiniteAnyNumber(this);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)aVar3.field_0;
}

Assistant:

ValueType ValueType::ToDefiniteNumber() const
{
    Assert(IsLikelyNumber());
    return IsNumber() ? *this : ToDefiniteAnyNumber();
}